

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O1

sexp_conflict sexp_make_term_attrs_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  sexp_conflict psVar1;
  undefined8 *puVar2;
  sexp_conflict res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_40;
  local_40 = (sexp_conflict)0x43e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(ctx,0x20,(long)(self->value).type.setters >> 1);
  local_40 = psVar1;
  puVar2 = (undefined8 *)calloc(1,0x3c);
  (psVar1->value).cpointer.value = puVar2;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  *(undefined8 *)((long)puVar2 + 0x2c) = 0;
  *(undefined8 *)((long)puVar2 + 0x34) = 0;
  psVar1->field_0x5 = psVar1->field_0x5 | 2;
  (ctx->value).context.saves = local_38.next;
  return local_40;
}

Assistant:

sexp sexp_make_term_attrs_stub (sexp ctx, sexp self, sexp_sint_t n) {
  struct termios* r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_tagged(ctx, sexp_sizeof(cpointer), sexp_unbox_fixnum(sexp_opcode_return_type(self)));
  sexp_cpointer_value(res) = calloc(1, sizeof(struct termios));
  r = (struct termios*) sexp_cpointer_value(res);
  memset(r, 0, sizeof(struct termios));
  sexp_freep(res) = 1;
  sexp_gc_release1(ctx);
  return res;
}